

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setWindowState(QWidget *this,WindowStates newstate)

{
  undefined1 *puVar1;
  uint uVar2;
  QWidgetPrivate *this_00;
  Representation RVar3;
  Representation RVar4;
  Representation RVar5;
  QTLWExtra *pQVar6;
  QWindow *pQVar7;
  QWidgetData *pQVar8;
  uint uVar9;
  QWidgetPrivate *d;
  QFlagsStorage<Qt::WindowState> QVar10;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = this->data;
  uVar2 = *(uint *)&pQVar8->field_0x10;
  QVar10.i = (Int)newstate.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                  super_QFlagsStorage<Qt::WindowState>.i;
  if (((uint)newstate.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i & 1) != 0) {
    QVar10.i = (uint)newstate.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                     super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7;
  }
  if ((uVar2 & 0xf) != QVar10.i) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    uVar9 = uVar2;
    if ((((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       ((this_00->high_attributes[0] & 0x10000000) == 0)) {
      create(this,0,false,false);
      pQVar8 = this->data;
      uVar9 = *(uint *)&pQVar8->field_0x10;
    }
    *(uint *)&pQVar8->field_0x10 = uVar9 & 0xfffffff0 | QVar10.i & 0xf;
    puVar1 = &this->data->field_0x10;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x800;
    pQVar8 = this->data;
    if (((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      if (((*(byte *)(*(long *)&this->field_0x8 + 0x241) & 4) == 0) &&
         ((pQVar8->widget_attributes & 0x8000) == 0)) {
        adjustSize(this);
      }
      QWidgetPrivate::createTLExtra(this_00);
      if ((uVar2 & 7) == 0) {
        pQVar8 = this->data;
        pQVar6 = QWidgetPrivate::topData(this_00);
        RVar3.m_i = (pQVar8->crect).y1.m_i;
        RVar4.m_i = (pQVar8->crect).x2.m_i;
        RVar5.m_i = (pQVar8->crect).y2.m_i;
        (pQVar6->normalGeometry).x1 = (Representation)(pQVar8->crect).x1.m_i;
        (pQVar6->normalGeometry).y1 = (Representation)RVar3.m_i;
        (pQVar6->normalGeometry).x2 = (Representation)RVar4.m_i;
        (pQVar6->normalGeometry).y2 = (Representation)RVar5.m_i;
      }
      pQVar7 = windowHandle(this);
      QWindow::setWindowStates
                (pQVar7,(uint)newstate.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                              super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7);
      pQVar8 = this->data;
    }
    pQVar8->field_0x11 = pQVar8->field_0x11 & 0xf7;
    if ((QVar10.i & 8) != 0) {
      activateWindow(this);
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    QWindowStateChangeEvent::QWindowStateChangeEvent
              ((QWindowStateChangeEvent *)&local_58,uVar2 & 0xf,0);
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_58);
    QWindowStateChangeEvent::~QWindowStateChangeEvent((QWindowStateChangeEvent *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setWindowState(Qt::WindowStates newstate)
{
    Q_D(QWidget);
    Qt::WindowStates oldstate = windowState();
    if (newstate.testFlag(Qt::WindowMinimized)) // QTBUG-46763
       newstate.setFlag(Qt::WindowActive, false);
    if (oldstate == newstate)
        return;
    if (isWindow() && !testAttribute(Qt::WA_WState_Created))
        create();

    data->window_state = newstate;
    data->in_set_window_state = 1;
    if (isWindow()) {
        // Ensure the initial size is valid, since we store it as normalGeometry below.
        if (!testAttribute(Qt::WA_Resized) && !isVisible())
            adjustSize();

        d->createTLExtra();
        if (!(oldstate & (Qt::WindowMinimized | Qt::WindowMaximized | Qt::WindowFullScreen)))
            d->topData()->normalGeometry = geometry();

        Q_ASSERT(windowHandle());
        windowHandle()->setWindowStates(newstate & ~Qt::WindowActive);
    }
    data->in_set_window_state = 0;

    if (newstate & Qt::WindowActive)
        activateWindow();

    QWindowStateChangeEvent e(oldstate);
    QCoreApplication::sendEvent(this, &e);
}